

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O3

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  Curl_easy *data;
  char **ppcVar1;
  byte bVar2;
  CURLcode CVar3;
  char *pcVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000031;
  char **ppcVar8;
  long lVar9;
  char *pcVar10;
  char *userp;
  char *response;
  long local_50;
  uchar *local_48;
  uchar *local_40;
  size_t len;
  
  data = conn->data;
  iVar7 = (int)CONCAT71(in_register_00000031,proxy);
  uVar6 = iVar7 << 5;
  ppcVar1 = &conn->user;
  ppcVar8 = &conn->passwd;
  lVar9 = 0x1740;
  if (iVar7 != 0) {
    lVar9 = 0x1728;
    ppcVar8 = &(conn->http_proxy).passwd;
    ppcVar1 = &(conn->http_proxy).user;
  }
  pcVar10 = *ppcVar8;
  userp = *ppcVar1;
  local_48 = request;
  local_40 = uripath;
  (*Curl_cfree)(*(void **)((long)data->sockets + lVar9 + -0x80));
  puVar5 = local_40;
  if (userp == (char *)0x0) {
    userp = "";
  }
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  *(undefined8 *)((long)data->sockets + lVar9 + -0x80) = 0;
  bVar2 = (&(data->state).authhost.field_0x18)[uVar6];
  if (*(long *)((long)&(data->state).digest.nonce + (ulong)(uint)(iVar7 << 6)) == 0) {
    bVar2 = bVar2 & 0xfe;
  }
  else {
    local_50 = lVar9;
    if (((bVar2 & 4) == 0) || (pcVar4 = strchr((char *)local_40,0x3f), pcVar4 == (char *)0x0)) {
      puVar5 = (uchar *)(*Curl_cstrdup)((char *)puVar5);
    }
    else {
      puVar5 = (uchar *)curl_maprintf("%.*s",(long)pcVar4 - (long)puVar5,puVar5);
    }
    if (puVar5 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar3 = Curl_auth_create_digest_http_message
                      (data,userp,pcVar10,local_48,puVar5,
                       (digestdata *)((long)&(data->state).digest.nonce + (ulong)(uint)(iVar7 << 6))
                       ,&response,&len);
    (*Curl_cfree)(puVar5);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar10 = "";
    if (proxy) {
      pcVar10 = "Proxy-";
    }
    pcVar10 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar10,response);
    lVar9 = local_50;
    *(char **)((long)data->sockets + local_50 + -0x80) = pcVar10;
    (*Curl_cfree)(response);
    if (*(long *)((long)data->sockets + lVar9 + -0x80) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    bVar2 = (&(data->state).authhost.field_0x18)[uVar6] | 1;
  }
  (&(data->state).authhost.field_0x18)[uVar6] = bVar2;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
#ifdef CURL_DISABLE_PROXY
    return CURLE_NOT_BUILT_IN;
#else
    digest = &data->state.proxydigest;
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    authp = &data->state.authproxy;
#endif
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &data->state.aptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      path = (unsigned char *) aprintf("%.*s", urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}